

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O2

void __thiscall ccs::RuleBuilder::Impl::~Impl(Impl *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Impl() {}